

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop.cpp
# Opt level: O3

void ncnn::binary_op_broadcast<ncnn::binary_op_atan2>(Mat *a,Mat *b,Mat *c,Option *opt)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  void *pvVar11;
  size_t sVar12;
  size_t sVar13;
  void *pvVar14;
  size_t sVar15;
  size_t sVar16;
  size_t sVar17;
  size_t sVar18;
  ulong uVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  void *pvVar30;
  long lVar31;
  float *pfVar32;
  long lVar33;
  long lVar34;
  float *pfVar35;
  ulong uVar36;
  void *pvVar37;
  float fVar38;
  ulong local_e0;
  
  iVar1 = c->dims;
  uVar2 = c->w;
  uVar3 = c->h;
  iVar4 = c->d;
  uVar5 = c->c;
  if (iVar1 == 2) {
    if ((int)uVar3 < 1) {
      return;
    }
    pvVar11 = a->data;
    iVar6 = a->w;
    pvVar14 = b->data;
    iVar7 = b->w;
    pvVar30 = c->data;
    sVar12 = c->elemsize;
    sVar13 = a->elemsize;
    uVar29 = (ulong)(a->h + -1);
    sVar15 = b->elemsize;
    uVar19 = (ulong)(b->h + -1);
    uVar28 = 0;
    do {
      uVar36 = uVar29;
      if ((long)uVar28 < (long)uVar29) {
        uVar36 = uVar28;
      }
      uVar27 = uVar19;
      if ((long)uVar28 < (long)uVar19) {
        uVar27 = uVar28;
      }
      if (0 < (int)uVar2) {
        pfVar35 = (float *)(uVar36 * (long)iVar6 * sVar13 + (long)pvVar11);
        pfVar32 = (float *)(uVar27 * (long)iVar7 * sVar15 + (long)pvVar14);
        uVar36 = 0;
        do {
          fVar38 = atan2f(*pfVar35,*pfVar32);
          *(float *)((long)pvVar30 + uVar36 * 4) = fVar38;
          uVar36 = uVar36 + 1;
          pfVar35 = pfVar35 + (1 < (long)iVar6);
          pfVar32 = pfVar32 + (1 < (long)iVar7);
        } while (uVar2 != uVar36);
      }
      uVar28 = uVar28 + 1;
      pvVar30 = (void *)((long)pvVar30 + sVar12 * (long)(int)uVar2);
    } while (uVar28 != uVar3);
  }
  else if (iVar1 == 1) {
    if ((int)uVar2 < 1) {
      return;
    }
    pvVar11 = c->data;
    iVar6 = b->w;
    iVar7 = a->w;
    pfVar32 = (float *)b->data;
    pfVar35 = (float *)a->data;
    uVar29 = 0;
    do {
      fVar38 = atan2f(*pfVar35,*pfVar32);
      *(float *)((long)pvVar11 + uVar29 * 4) = fVar38;
      uVar29 = uVar29 + 1;
      pfVar35 = pfVar35 + (1 < iVar7);
      pfVar32 = pfVar32 + (1 < iVar6);
    } while (uVar2 != uVar29);
  }
  if (0 < (int)uVar5 && iVar1 - 3U < 2) {
    pvVar11 = c->data;
    sVar12 = c->cstep;
    sVar13 = c->elemsize;
    iVar1 = a->w;
    iVar6 = b->w;
    local_e0 = 0;
    do {
      if (0 < iVar4) {
        pvVar37 = (void *)(sVar12 * sVar13 * local_e0 + (long)pvVar11);
        iVar7 = a->w;
        iVar8 = a->h;
        pvVar14 = a->data;
        sVar15 = a->elemsize;
        iVar9 = b->w;
        iVar10 = b->h;
        pvVar30 = b->data;
        sVar16 = b->elemsize;
        uVar29 = (ulong)(b->c + -1);
        if ((long)local_e0 < (long)uVar29) {
          uVar29 = local_e0;
        }
        sVar17 = b->cstep;
        lVar33 = (long)(b->d + -1);
        uVar19 = (ulong)(a->c + -1);
        if ((long)local_e0 < (long)uVar19) {
          uVar19 = local_e0;
        }
        sVar18 = a->cstep;
        lVar20 = (long)(iVar10 + -1);
        lVar21 = (long)(a->d + -1);
        lVar22 = (long)(iVar8 + -1);
        lVar25 = 0;
        do {
          lVar26 = lVar33;
          if (lVar25 < lVar33) {
            lVar26 = lVar25;
          }
          lVar23 = lVar21;
          if (lVar25 < lVar21) {
            lVar23 = lVar25;
          }
          if (0 < (int)uVar3) {
            lVar24 = 0;
            do {
              lVar31 = lVar20;
              if (lVar24 < lVar20) {
                lVar31 = lVar24;
              }
              lVar34 = lVar22;
              if (lVar24 < lVar22) {
                lVar34 = lVar24;
              }
              if (0 < (int)uVar2) {
                pfVar32 = (float *)(((lVar31 + lVar26 * iVar10) * (long)iVar9 + uVar29 * sVar17) *
                                    sVar16 + (long)pvVar30);
                pfVar35 = (float *)(((lVar34 + lVar23 * iVar8) * (long)iVar7 + uVar19 * sVar18) *
                                    sVar15 + (long)pvVar14);
                uVar28 = 0;
                do {
                  fVar38 = atan2f(*pfVar35,*pfVar32);
                  *(float *)((long)pvVar37 + uVar28 * 4) = fVar38;
                  uVar28 = uVar28 + 1;
                  pfVar32 = pfVar32 + (1 < iVar6);
                  pfVar35 = pfVar35 + (1 < iVar1);
                } while (uVar2 != uVar28);
              }
              pvVar37 = (void *)((long)pvVar37 + (long)(int)uVar2 * 4);
              lVar24 = lVar24 + 1;
            } while ((uint)lVar24 != uVar3);
          }
          lVar25 = lVar25 + 1;
        } while ((int)lVar25 != iVar4);
      }
      local_e0 = local_e0 + 1;
    } while (local_e0 != uVar5);
  }
  return;
}

Assistant:

static void binary_op_broadcast(const Mat& a, const Mat& b, Mat& c, const Option& opt)
{
    // general broadcast
    const Op op;

    const int dims = c.dims;
    const int w = c.w;
    const int h = c.h;
    const int d = c.d;
    const int channels = c.c;

    if (dims == 1)
    {
        const float* ptr = a;
        const float* ptr1 = b;
        float* outptr = c;

        const int ainc = a.w > 1 ? 1 : 0;
        const int binc = b.w > 1 ? 1 : 0;

        for (int x = 0; x < w; x++)
        {
            outptr[x] = op(*ptr, *ptr1);
            ptr += ainc;
            ptr1 += binc;
        }
    }

    if (dims == 2)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int y = 0; y < h; y++)
        {
            const float* ptr = a.row(std::min(y, a.h - 1));
            const float* ptr1 = b.row(std::min(y, b.h - 1));
            float* outptr = c.row(y);

            const int ainc = a.w > 1 ? 1 : 0;
            const int binc = b.w > 1 ? 1 : 0;

            for (int x = 0; x < w; x++)
            {
                outptr[x] = op(*ptr, *ptr1);
                ptr += ainc;
                ptr1 += binc;
            }
        }
    }

    if (dims == 3 || dims == 4)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* outptr = c.channel(q);

            const int ainc = a.w > 1 ? 1 : 0;
            const int binc = b.w > 1 ? 1 : 0;

            for (int z = 0; z < d; z++)
            {
                for (int y = 0; y < h; y++)
                {
                    const float* ptr = a.channel(std::min(q, a.c - 1)).depth(std::min(z, a.d - 1)).row(std::min(y, a.h - 1));
                    const float* ptr1 = b.channel(std::min(q, b.c - 1)).depth(std::min(z, b.d - 1)).row(std::min(y, b.h - 1));

                    for (int x = 0; x < w; x++)
                    {
                        outptr[x] = op(*ptr, *ptr1);
                        ptr += ainc;
                        ptr1 += binc;
                    }

                    outptr += w;
                }
            }
        }
    }
}